

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<capnp::SchemaLoader::Impl> __thiscall
kj::
heap<capnp::SchemaLoader::Impl,capnp::SchemaLoader&,capnp::SchemaLoader::LazyLoadCallback_const&>
          (kj *this,SchemaLoader *params,LazyLoadCallback *params_1)

{
  Impl *this_00;
  Impl *extraout_RDX;
  Own<capnp::SchemaLoader::Impl> OVar1;
  
  this_00 = (Impl *)operator_new(0x1b0);
  capnp::SchemaLoader::Impl::Impl(this_00,params,params_1);
  *(undefined8 **)this = &_::HeapDisposer<capnp::SchemaLoader::Impl>::instance;
  *(Impl **)(this + 8) = this_00;
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}